

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

KeyID __thiscall
anon_unknown.dwarf_18fc05::SQLiteBuildDB::getKeyIDForID
          (SQLiteBuildDB *this,DBKeyID dbKeyID,string *error_out)

{
  BuildDBDelegate *pBVar1;
  int iVar2;
  char *data;
  undefined4 extraout_var;
  value_type *pvVar3;
  value_type *pvVar4;
  KeyID KVar5;
  iterator iVar6;
  DBKeyID dbKeyID_local;
  string local_58;
  KeyID local_38;
  
  dbKeyID_local = dbKeyID;
  iVar6 = llvm::
          DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
          ::find((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                  *)&this->engineKeyIDs,&dbKeyID_local);
  if (iVar6.Ptr == (this->engineKeyIDs).Buckets + (this->engineKeyIDs).NumBuckets) {
    iVar2 = sqlite3_reset(this->findKeyNameForKeyIDStmt);
    if ((((iVar2 == 0) &&
         (iVar2 = sqlite3_clear_bindings(this->findKeyNameForKeyIDStmt), iVar2 == 0)) &&
        (iVar2 = sqlite3_bind_int64(this->findKeyNameForKeyIDStmt,1,dbKeyID_local.value), iVar2 == 0
        )) && (iVar2 = sqlite3_step(this->findKeyNameForKeyIDStmt), iVar2 == 100)) {
      iVar2 = sqlite3_column_count(this->findKeyNameForKeyIDStmt);
      if (iVar2 == 1) {
        iVar2 = sqlite3_column_bytes(this->findKeyNameForKeyIDStmt,0);
        data = (char *)sqlite3_column_text(this->findKeyNameForKeyIDStmt,0);
        pBVar1 = this->delegate;
        llbuild::core::KeyType::KeyType((KeyType *)&local_58,data,(long)iVar2);
        iVar2 = (*pBVar1->_vptr_BuildDBDelegate[2])(pBVar1,&local_58);
        local_38._value = CONCAT44(extraout_var,iVar2);
        std::__cxx11::string::_M_dispose();
        pvVar3 = llvm::
                 DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                 ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                     *)&this->engineKeyIDs,&dbKeyID_local);
        (pvVar3->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value =
             CONCAT44(extraout_var,iVar2);
        pvVar4 = llvm::
                 DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                 ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                     *)&this->dbKeyIDs,&local_38);
        (pvVar4->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = dbKeyID_local.value;
        return (KeyID)local_38._value;
      }
      __assert_fail("sqlite3_column_count(findKeyNameForKeyIDStmt) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                    ,0x3cf,
                    "KeyID (anonymous namespace)::SQLiteBuildDB::getKeyIDForID(DBKeyID, std::string *)"
                   );
    }
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_58,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&local_58);
    std::__cxx11::string::_M_dispose();
    KVar5._value = 0;
  }
  else {
    KVar5._value = ((iVar6.Ptr)->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value;
  }
  return (KeyID)KVar5._value;
}

Assistant:

KeyID getKeyIDForID(DBKeyID dbKeyID, std::string *error_out) {
#define checkSQLiteResultOKReturnKeyID(result) \
if (result != SQLITE_OK) { \
  *error_out = getCurrentErrorMessage(); \
  return KeyID(); \
}

    // Search local db <-> engine mapping cache
    auto it = engineKeyIDs.find(dbKeyID);
    if (it != engineKeyIDs.end())
      return it->second;

    // Search for the key in the database
    int result;
    result = sqlite3_reset(findKeyNameForKeyIDStmt);
    checkSQLiteResultOKReturnKeyID(result);
    result = sqlite3_clear_bindings(findKeyNameForKeyIDStmt);
    checkSQLiteResultOKReturnKeyID(result);
    result = sqlite3_bind_int64(findKeyNameForKeyIDStmt, /*index=*/1, dbKeyID.value);
    checkSQLiteResultOKReturnKeyID(result);

    result = sqlite3_step(findKeyNameForKeyIDStmt);
    if (result != SQLITE_ROW) {
      *error_out = getCurrentErrorMessage();
      return KeyID();
    }
    assert(sqlite3_column_count(findKeyNameForKeyIDStmt) == 1);

    // Found a key
    auto size = sqlite3_column_bytes(findKeyNameForKeyIDStmt, 0);
    auto text = (const char*) sqlite3_column_text(findKeyNameForKeyIDStmt, 0);

    // Map the key to an engine ID
    auto engineKeyID = delegate->getKeyID(KeyType(text, size));

    // Cache the mapping locally
    engineKeyIDs[dbKeyID] = engineKeyID;
    dbKeyIDs[engineKeyID] = dbKeyID;

    return engineKeyID;
#undef checkSQLiteResultOKReturnKeyID
  }